

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::ExpandLinkItems
          (cmTarget *this,string *prop,string *value,string *config,cmTarget *headTarget,
          bool usage_requirements_only,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items,
          bool *hadHeadSensitiveCondition)

{
  cmMakefile *mf;
  bool bVar1;
  string *target;
  cmCompiledGeneratorExpression *pcVar2;
  char *pcVar3;
  allocator local_179;
  string local_178;
  string local_158;
  cmGeneratorExpression local_138;
  cmCompiledGeneratorExpression *local_130;
  auto_ptr<cmCompiledGeneratorExpression> local_128;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  undefined1 local_f8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorExpression ge;
  bool usage_requirements_only_local;
  cmTarget *headTarget_local;
  string *config_local;
  string *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&dagChecker.CheckResult,(cmListFileBacktrace *)0x0);
  target = GetName_abi_cxx11_(this);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_f8,target,prop,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  if (usage_requirements_only) {
    cmGeneratorExpressionDAGChecker::SetTransitivePropertiesOnly
              ((cmGeneratorExpressionDAGChecker *)local_f8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&cge);
  cmGeneratorExpression::Parse(&local_138,(string *)&dagChecker.CheckResult);
  local_130 = (cmCompiledGeneratorExpression *)
              cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_138);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_128,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_130);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_138);
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_128);
  mf = this->Makefile;
  std::__cxx11::string::string((string *)&local_178);
  pcVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar2,mf,config,false,headTarget,this,
                      (cmGeneratorExpressionDAGChecker *)local_f8,&local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,pcVar3,&local_179);
  cmSystemTools::ExpandListArgument
            (&local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cge,false);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string((string *)&local_178);
  LookupLinkItems(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cge,items);
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_128);
  bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar2);
  *hadHeadSensitiveCondition = bVar1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&cge);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_f8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&dagChecker.CheckResult);
  return;
}

Assistant:

void cmTarget::ExpandLinkItems(std::string const& prop,
                               std::string const& value,
                               std::string const& config,
                               cmTarget const* headTarget,
                               bool usage_requirements_only,
                               std::vector<cmLinkItem>& items,
                               bool& hadHeadSensitiveCondition) const
{
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(), prop, 0, 0);
  // The $<LINK_ONLY> expression may be in a link interface to specify private
  // link dependencies that are otherwise excluded from usage requirements.
  if(usage_requirements_only)
    {
    dagChecker.SetTransitivePropertiesOnly();
    }
  std::vector<std::string> libs;
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
  cmSystemTools::ExpandListArgument(cge->Evaluate(
                                      this->Makefile,
                                      config,
                                      false,
                                      headTarget,
                                      this, &dagChecker), libs);
  this->LookupLinkItems(libs, items);
  hadHeadSensitiveCondition = cge->GetHadHeadSensitiveCondition();
}